

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::send_udp_packet_hostname_listen
          (session_impl *this,listen_socket_handle *sock,char *hostname,int port,span<const_char> p,
          error_code *ec,udp_send_flags_t flags)

{
  int port_00;
  char *hostname_00;
  span<const_char> local_78;
  listen_socket_handle local_68;
  weak_ptr<libtorrent::aux::utp_socket_interface> local_58;
  listen_socket_t *local_48;
  listen_socket_t *s;
  char *pcStack_38;
  int port_local;
  char *hostname_local;
  listen_socket_handle *sock_local;
  session_impl *this_local;
  undefined1 auStack_18 [7];
  udp_send_flags_t flags_local;
  span<const_char> p_local;
  
  _auStack_18 = p.m_ptr;
  this_local._7_1_ = (udp_send_flags_t)flags.m_val;
  s._4_4_ = port;
  pcStack_38 = hostname;
  hostname_local = (char *)sock;
  sock_local = (listen_socket_handle *)this;
  local_48 = listen_socket_handle::get(sock);
  if (local_48 == (listen_socket_t *)0x0) {
    boost::system::error_code::operator=(ec,bad_descriptor);
  }
  else {
    listen_socket_handle::get_ptr(&local_68);
    ::std::weak_ptr<libtorrent::aux::utp_socket_interface>::
    weak_ptr<libtorrent::aux::listen_socket_t,void>(&local_58,&local_68.m_sock);
    hostname_00 = pcStack_38;
    port_00 = s._4_4_;
    span<char_const>::span<libtorrent::span<char_const>,char_const,void>
              ((span<char_const> *)&local_78,(span<const_char> *)auStack_18);
    send_udp_packet_hostname(this,&local_58,hostname_00,port_00,local_78,ec,this_local._7_1_);
    ::std::weak_ptr<libtorrent::aux::utp_socket_interface>::~weak_ptr(&local_58);
    ::std::weak_ptr<libtorrent::aux::listen_socket_t>::~weak_ptr(&local_68.m_sock);
  }
  return;
}

Assistant:

void send_udp_packet_hostname_listen(aux::listen_socket_handle const& sock
				, char const* hostname
				, int port
				, span<char const> p
				, error_code& ec
				, udp_send_flags_t const flags)
			{
				listen_socket_t* s = sock.get();
				if (!s)
				{
					ec = boost::asio::error::bad_descriptor;
					return;
				}
				send_udp_packet_hostname(sock.get_ptr(), hostname, port, p, ec, flags);
			}